

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::ColladaExporter
          (ColladaExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file)

{
  _Rb_tree_header *p_Var1;
  allocator local_50 [8];
  string *local_48;
  string *local_40;
  locale local_38 [8];
  
  this->_vptr_ColladaExporter = (_func_int **)&PTR__ColladaExporter_008c7928;
  local_40 = &this->mFoundSkeletonRootNodeID;
  std::__cxx11::string::string((string *)local_40,"skeleton_root",local_50);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->mOutput);
  this->mIOSystem = pIOSystem;
  std::__cxx11::string::string((string *)&this->mPath,(string *)path);
  local_48 = &this->mPath;
  std::__cxx11::string::string((string *)&this->mFile,(string *)file);
  (this->startstr)._M_dataplus._M_p = (pointer)&(this->startstr).field_2;
  (this->startstr)._M_string_length = 0;
  (this->startstr).field_2._M_local_buf[0] = '\0';
  (this->endstr)._M_dataplus._M_p = (pointer)&(this->endstr).field_2;
  (this->endstr)._M_string_length = 0;
  (this->endstr).field_2._M_local_buf[0] = '\0';
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->textures)._M_t._M_impl.super__Rb_tree_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::locale::locale((locale *)local_50,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale((locale *)local_50);
  *(undefined8 *)(&this->field_0x30 + *(long *)(*(long *)&this->mOutput + -0x18)) = 8;
  this->mScene = pScene;
  this->mSceneOwned = false;
  std::__cxx11::string::assign((char *)&this->endstr);
  WriteFile(this);
  return;
}

Assistant:

ColladaExporter::ColladaExporter( const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file) 
: mIOSystem(pIOSystem)
, mPath(path)
, mFile(file) {
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    mScene = pScene;
    mSceneOwned = false;

    // set up strings
    endstr = "\n";

    // start writing the file
    WriteFile();
}